

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O1

PCRE2_SPTR8 get_chr_property_list(PCRE2_SPTR8 code,BOOL utf,uint8_t *fcc,uint32_t *list)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  ushort *puVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  ushort *puVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  bVar9 = *code;
  *list = (uint)bVar9;
  list[1] = 0;
  puVar8 = (ushort *)(code + 1);
  if ((byte)(bVar9 - 0x21) < 0x41) {
    bVar2 = bVar9;
    if ((((bVar9 < 0x62) && (bVar2 = 0x55, bVar9 < 0x55)) && (bVar2 = 0x48, bVar9 < 0x48)) &&
       ((bVar2 = 0x3b, bVar9 < 0x3b && (bVar2 = 0x2e, bVar9 < 0x2e)))) {
      bVar2 = 0x21;
    }
    bVar9 = (bVar9 - bVar2) + 0x21;
    if ((bVar9 < 0x2e) && ((0x238000000000U >> ((ulong)bVar9 & 0x3f) & 1) != 0)) {
      puVar8 = (ushort *)(code + 3);
    }
    if ((0x29 < bVar9) || (uVar6 = 0, (0x21800000000U >> ((ulong)bVar9 & 0x3f) & 1) == 0)) {
      uVar6 = (uint32_t)(bVar9 != 0x2b);
    }
    list[1] = uVar6;
    if (bVar2 < 0x3b) {
      if (bVar2 == 0x21) {
        *list = 0x1d;
      }
      else if (bVar2 == 0x2e) {
        *list = 0x1e;
      }
    }
    else if (bVar2 == 0x3b) {
      *list = 0x1f;
    }
    else if (bVar2 == 0x48) {
      *list = 0x20;
    }
    else if (bVar2 == 0x55) {
      *list = (uint)(byte)*puVar8;
      puVar8 = (ushort *)((long)puVar8 + 1);
    }
    bVar9 = (byte)*list;
  }
  switch(bVar9) {
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
    return (PCRE2_SPTR8)puVar8;
  case 0xe:
  case 0x1b:
  case 0x1c:
    return (PCRE2_SPTR8)0x0;
  case 0xf:
  case 0x10:
    if ((byte)*puVar8 != 9) {
      list[2] = (uint)(byte)*puVar8;
      list[3] = (uint)*(byte *)((long)puVar8 + 1);
      return (PCRE2_SPTR8)(puVar8 + 1);
    }
    bVar2 = *(byte *)((long)puVar8 + 1);
    uVar7 = 8;
    do {
      if (0x1f < uVar7) {
        list[2] = (uint)(byte)puVar8[1];
        list[3] = (uint)*(byte *)((long)puVar8 + 3);
        return (PCRE2_SPTR8)(puVar8 + 1);
      }
      iVar1 = *(int *)(&UNK_00129ef8 + uVar7 + (ulong)bVar2 * 4);
      *(int *)((long)list + uVar7) = iVar1;
      uVar7 = uVar7 + 4;
    } while (iVar1 != -1);
    *list = (uint)(bVar9 != 0x10) * 2 + 0x1d;
    return (PCRE2_SPTR8)(puVar8 + 1);
  case 0x1d:
  case 0x1f:
    puVar4 = (ushort *)((long)puVar8 + 1);
    bVar9 = (byte)*puVar8;
    uVar6 = (uint32_t)bVar9;
    if ((utf != 0) && (0xbf < bVar9)) {
      if ((bVar9 & 0x20) == 0) {
        puVar4 = puVar8 + 1;
        uVar6 = (bVar9 & 0x1f) << 6 | *(byte *)((long)puVar8 + 1) & 0x3f;
      }
      else {
        uVar5 = *(byte *)puVar4 & 0x3f;
        if ((bVar9 & 0x10) == 0) {
          uVar6 = (byte)puVar8[1] & 0x3f | uVar5 << 6 | (uVar6 & 0xf) << 0xc;
          puVar4 = (ushort *)((long)puVar8 + 3);
        }
        else if ((bVar9 & 8) == 0) {
          uVar6 = *(byte *)((long)puVar8 + 3) & 0x3f |
                  ((byte)puVar8[1] & 0x3f) << 6 | uVar5 << 0xc | (uVar6 & 7) << 0x12;
          puVar4 = puVar8 + 2;
        }
        else {
          uVar11 = (byte)puVar8[1] & 0x3f;
          uVar3 = *(byte *)((long)puVar8 + 3) & 0x3f;
          uVar10 = (byte)puVar8[2] & 0x3f;
          if ((bVar9 & 4) == 0) {
            uVar6 = uVar3 << 6 | uVar11 << 0xc | uVar5 << 0x12 | (uVar6 & 3) << 0x18 | uVar10;
            puVar4 = (ushort *)((long)puVar8 + 5);
          }
          else {
            uVar6 = *(byte *)((long)puVar8 + 5) & 0x3f |
                    uVar10 << 6 |
                    uVar3 << 0xc | uVar11 << 0x12 | uVar5 << 0x18 | (uVar6 & 1) << 0x1e;
            puVar4 = puVar8 + 3;
          }
        }
      }
    }
    list[2] = uVar6;
    break;
  case 0x1e:
  case 0x20:
    *list = (bVar9 != 0x1e) + 0x1d + (uint)(bVar9 != 0x1e);
    puVar4 = (ushort *)((long)puVar8 + 1);
    bVar9 = (byte)*puVar8;
    uVar5 = (uint)bVar9;
    if ((utf != 0) && (0xbf < bVar9)) {
      if ((bVar9 & 0x20) == 0) {
        puVar4 = puVar8 + 1;
        uVar5 = (bVar9 & 0x1f) << 6 | *(byte *)((long)puVar8 + 1) & 0x3f;
      }
      else {
        uVar3 = *(byte *)puVar4 & 0x3f;
        if ((bVar9 & 0x10) == 0) {
          uVar5 = (byte)puVar8[1] & 0x3f | uVar3 << 6 | (uVar5 & 0xf) << 0xc;
          puVar4 = (ushort *)((long)puVar8 + 3);
        }
        else if ((bVar9 & 8) == 0) {
          uVar5 = *(byte *)((long)puVar8 + 3) & 0x3f |
                  ((byte)puVar8[1] & 0x3f) << 6 | uVar3 << 0xc | (uVar5 & 7) << 0x12;
          puVar4 = puVar8 + 2;
        }
        else {
          uVar12 = (byte)puVar8[1] & 0x3f;
          uVar10 = *(byte *)((long)puVar8 + 3) & 0x3f;
          uVar11 = (byte)puVar8[2] & 0x3f;
          if ((bVar9 & 4) == 0) {
            uVar5 = uVar10 << 6 | uVar12 << 0xc | uVar3 << 0x12 | (uVar5 & 3) << 0x18 | uVar11;
            puVar4 = (ushort *)((long)puVar8 + 5);
          }
          else {
            uVar5 = *(byte *)((long)puVar8 + 5) & 0x3f |
                    uVar11 << 6 |
                    uVar10 << 0xc | uVar12 << 0x12 | uVar3 << 0x18 | (uVar5 & 1) << 0x1e;
            puVar4 = puVar8 + 3;
          }
        }
      }
    }
    list[2] = uVar5;
    if ((uVar5 < 0x80) || (utf == 0 && uVar5 < 0x100)) {
      uVar6 = (uint32_t)fcc[uVar5];
    }
    else {
      uVar6 = _pcre2_ucd_records_8
              [*(ushort *)
                ((long)_pcre2_ucd_stage2_8 +
                (ulong)((uint)""[uVar5 >> 7] * 0x100 + (uVar5 & 0x7f) * 2))].other_case + uVar5;
    }
    list[3] = uVar6;
    if (uVar5 != uVar6) {
      list[4] = 0xffffffff;
      return (PCRE2_SPTR8)puVar4;
    }
    break;
  default:
    if (bVar9 - 0x6e < 2) {
      puVar4 = puVar8 + 0x10;
    }
    else {
      if (bVar9 != 0x70) {
        return (PCRE2_SPTR8)0x0;
      }
      puVar4 = (ushort *)((long)puVar8 + ((ulong)(ushort)(*puVar8 << 8 | *puVar8 >> 8) - 1));
    }
    uVar5 = (byte)*puVar4 - 0x62;
    if (uVar5 < 0xc) {
      if ((0x533U >> (uVar5 & 0x1f) & 1) == 0) {
        if ((0x20cU >> (uVar5 & 0x1f) & 1) == 0) {
          list[1] = (uint)((*(ushort *)((long)puVar4 + 1) & 0xff) == 0 &&
                          *(ushort *)((long)puVar4 + 1) >> 8 == 0);
          puVar4 = (ushort *)((long)puVar4 + 5);
          goto LAB_001239d4;
        }
      }
      else {
        list[1] = 1;
      }
      puVar4 = (ushort *)((long)puVar4 + 1);
    }
LAB_001239d4:
    list[2] = (int)puVar4 - (int)puVar8;
    return (PCRE2_SPTR8)puVar4;
  }
  list[3] = 0xffffffff;
  return (PCRE2_SPTR8)puVar4;
}

Assistant:

static PCRE2_SPTR
get_chr_property_list(PCRE2_SPTR code, BOOL utf, const uint8_t *fcc,
  uint32_t *list)
{
PCRE2_UCHAR c = *code;
PCRE2_UCHAR base;
PCRE2_SPTR end;
uint32_t chr;

#ifdef SUPPORT_UNICODE
uint32_t *clist_dest;
const uint32_t *clist_src;
#else
(void)utf;    /* Suppress "unused parameter" compiler warning */
#endif

list[0] = c;
list[1] = FALSE;
code++;

if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
  {
  base = get_repeat_base(c);
  c -= (base - OP_STAR);

  if (c == OP_UPTO || c == OP_MINUPTO || c == OP_EXACT || c == OP_POSUPTO)
    code += IMM2_SIZE;

  list[1] = (c != OP_PLUS && c != OP_MINPLUS && c != OP_EXACT &&
             c != OP_POSPLUS);

  switch(base)
    {
    case OP_STAR:
    list[0] = OP_CHAR;
    break;

    case OP_STARI:
    list[0] = OP_CHARI;
    break;

    case OP_NOTSTAR:
    list[0] = OP_NOT;
    break;

    case OP_NOTSTARI:
    list[0] = OP_NOTI;
    break;

    case OP_TYPESTAR:
    list[0] = *code;
    code++;
    break;
    }
  c = list[0];
  }

switch(c)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  case OP_ANY:
  case OP_ALLANY:
  case OP_ANYNL:
  case OP_NOT_HSPACE:
  case OP_HSPACE:
  case OP_NOT_VSPACE:
  case OP_VSPACE:
  case OP_EXTUNI:
  case OP_EODN:
  case OP_EOD:
  case OP_DOLL:
  case OP_DOLLM:
  return code;

  case OP_CHAR:
  case OP_NOT:
  GETCHARINCTEST(chr, code);
  list[2] = chr;
  list[3] = NOTACHAR;
  return code;

  case OP_CHARI:
  case OP_NOTI:
  list[0] = (c == OP_CHARI) ? OP_CHAR : OP_NOT;
  GETCHARINCTEST(chr, code);
  list[2] = chr;

#ifdef SUPPORT_UNICODE
  if (chr < 128 || (chr < 256 && !utf))
    list[3] = fcc[chr];
  else
    list[3] = UCD_OTHERCASE(chr);
#elif defined SUPPORT_WIDE_CHARS
  list[3] = (chr < 256) ? fcc[chr] : chr;
#else
  list[3] = fcc[chr];
#endif

  /* The othercase might be the same value. */

  if (chr == list[3])
    list[3] = NOTACHAR;
  else
    list[4] = NOTACHAR;
  return code;

#ifdef SUPPORT_UNICODE
  case OP_PROP:
  case OP_NOTPROP:
  if (code[0] != PT_CLIST)
    {
    list[2] = code[0];
    list[3] = code[1];
    return code + 2;
    }

  /* Convert only if we have enough space. */

  clist_src = PRIV(ucd_caseless_sets) + code[1];
  clist_dest = list + 2;
  code += 2;

  do {
     if (clist_dest >= list + 8)
       {
       /* Early return if there is not enough space. This should never
       happen, since all clists are shorter than 5 character now. */
       list[2] = code[0];
       list[3] = code[1];
       return code;
       }
     *clist_dest++ = *clist_src;
     }
  while(*clist_src++ != NOTACHAR);

  /* All characters are stored. The terminating NOTACHAR is copied from the
  clist itself. */

  list[0] = (c == OP_PROP) ? OP_CHAR : OP_NOT;
  return code;
#endif

  case OP_NCLASS:
  case OP_CLASS:
#ifdef SUPPORT_WIDE_CHARS
  case OP_XCLASS:
  if (c == OP_XCLASS)
    end = code + GET(code, 0) - 1;
  else
#endif
    end = code + 32 / sizeof(PCRE2_UCHAR);

  switch(*end)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRQUERY:
    case OP_CRMINQUERY:
    case OP_CRPOSSTAR:
    case OP_CRPOSQUERY:
    list[1] = TRUE;
    end++;
    break;

    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSPLUS:
    end++;
    break;

    case OP_CRRANGE:
    case OP_CRMINRANGE:
    case OP_CRPOSRANGE:
    list[1] = (GET2(end, 1) == 0);
    end += 1 + 2 * IMM2_SIZE;
    break;
    }
  list[2] = (uint32_t)(end - code);
  return end;
  }
return NULL;    /* Opcode not accepted */
}